

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset.cpp
# Opt level: O3

void trimesh::
     assign_pairs2<1,boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>
               (dataset_t *ds,counting_iterator<int,_boost::use_default,_boost::use_default> *b,
               counting_iterator<int,_boost::use_default,_boost::use_default> *e)

{
  int iVar1;
  tri_cc_t *ptVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  cellid_t *pcVar6;
  ostream *poVar7;
  runtime_error *this;
  long lVar8;
  cellid_t *pcVar9;
  cellid_t *c2;
  int iVar10;
  ulong uVar11;
  cellid_t cf [20];
  stringstream ss;
  cellid_t local_228;
  cellid_t local_224 [19];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  iVar10 = (b->super_type).m_iterator;
  if (iVar10 != (e->super_type).m_iterator) {
    do {
      if ((ds->m_cell_pairs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] == invalid_cellid) {
        ptVar2 = (ds->m_tcc).px;
        if (ptVar2 == (tri_cc_t *)0x0) goto LAB_00156540;
        uVar5 = tri_cc_t::get_cell_co_facets(ptVar2,iVar10,&local_228);
        if (0x13 < uVar5) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Failed to ensure condition ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"pos < size",10);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset.cpp"
                     ,0x67);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"assign_pairs2",0xd);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(local_1a8,0x6e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"A maximum of 20 cofacets are assumed. Adjust const above!!",0x3a);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this,local_1d8);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (uVar5 != 0) {
          iVar10 = (b->super_type).m_iterator;
          lVar8 = 0;
          uVar11 = 0;
          do {
            iVar1 = *(int *)((long)local_224 + lVar8 + -4);
            if (((ds->m_cell_pairs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1] == invalid_cellid) &&
               (pcVar6 = dataset_t::max_fct(ds,iVar1), *pcVar6 != iVar10)) {
              pcVar6 = dataset_t::max_fct(ds,*(cellid_t *)((long)local_224 + lVar8 + -4));
              pcVar6 = dataset_t::max_fct(ds,*pcVar6);
              iVar1 = *pcVar6;
              pcVar6 = dataset_t::max_fct(ds,iVar10);
              if (iVar1 == *pcVar6) {
                *(undefined4 *)((long)local_224 + (uVar11 - 4)) =
                     *(undefined4 *)((long)local_224 + lVar8 + -4);
                uVar11 = uVar11 + 4;
              }
            }
            lVar8 = lVar8 + 4;
          } while ((ulong)uVar5 << 2 != lVar8);
          pcVar9 = &local_228;
          if ((uVar11 & 0xfffffffffffffffb) != 0) {
            lVar8 = uVar11 - 4;
            pcVar6 = local_224;
            c2 = &local_228;
            do {
              bVar3 = dataset_t::compare_cells<2>(ds,pcVar6,c2);
              pcVar9 = pcVar6;
              if (!bVar3) {
                pcVar9 = c2;
              }
              pcVar6 = pcVar6 + 1;
              lVar8 = lVar8 + -4;
              c2 = pcVar9;
            } while (lVar8 != 0);
          }
          if (pcVar9 != (cellid_t *)((long)local_224 + (uVar11 - 4))) {
            ptVar2 = (ds->m_tcc).px;
            if (ptVar2 == (tri_cc_t *)0x0) {
LAB_00156540:
              __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                            "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
                           );
            }
            bVar3 = tri_cc_t::is_cell_boundry(ptVar2,*pcVar9);
            ptVar2 = (ds->m_tcc).px;
            if (ptVar2 == (tri_cc_t *)0x0) goto LAB_00156540;
            bVar4 = tri_cc_t::is_cell_boundry(ptVar2,(b->super_type).m_iterator);
            if (bVar3 == bVar4) {
              dataset_t::pair(ds,(b->super_type).m_iterator,*pcVar9);
            }
          }
        }
      }
      iVar10 = (b->super_type).m_iterator + 1;
      (b->super_type).m_iterator = iVar10;
    } while (iVar10 != (e->super_type).m_iterator);
  }
  return;
}

Assistant:

inline void assign_pairs2(dataset_t &ds,Titer b,Titer e)
  {
	const int size = 20;
	cellid_t cf[size],*cfe;

    BOOST_AUTO(cmp,bind(&dataset_t::compare_cells<dim+1>,&ds,_1,_2));

    int np = 0;

    for(;b!=e;++b)
      if(!ds.is_paired(*b))
      {
		uint pos = ds.get_cets<ASC>(*b, cf);
		ENSURES(pos < size)
				  <<"A maximum of 20 cofacets are assumed. Adjust const above!!";
		cfe = cf + pos;
		cfe = filter_elst2(cf,cfe,cf,*b,ds);

        cellid_t *mcf = min_element(cf,cfe,cmp);

        if( mcf != cfe && ds.is_boundry(*mcf) == ds.is_boundry(*b))
        {
          ds.pair(*b,*mcf); np++;
        }
      }
  }